

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O1

int avl_comp_cfgio(void *txt1,void *txt2)

{
  int iVar1;
  char *pcVar2;
  size_t __n;
  ulong uVar3;
  
  pcVar2 = strstr((char *)txt1,"://");
  uVar3 = -(ulong)(pcVar2 == (char *)0x0) | (long)pcVar2 - (long)txt1;
  pcVar2 = strstr((char *)txt2,"://");
  __n = (long)pcVar2 - (long)txt2;
  if ((long)pcVar2 - (long)txt2 <= (long)uVar3) {
    __n = uVar3;
  }
  if (pcVar2 == (char *)0x0) {
    __n = uVar3;
  }
  if (__n != 0xffffffffffffffff) {
    iVar1 = strncasecmp((char *)txt1,(char *)txt2,__n);
    return iVar1;
  }
  iVar1 = strcasecmp((char *)txt1,(char *)txt2);
  return iVar1;
}

Assistant:

static int
avl_comp_cfgio(const void *txt1, const void *txt2) {
  const char *url1 = txt1;
  const char *url2 = txt2;
  const char *ptr;
  ssize_t maxlen = -1;

  ptr = strstr(url1, CFG_IO_URL_SPLITTER);
  if (ptr) {
    maxlen = ptr - url1;
  }
  ptr = strstr(url2, CFG_IO_URL_SPLITTER);
  if (ptr) {
    if ((ptr - url2) > maxlen) {
      maxlen = ptr - url2;
    }
  }

  if (maxlen != -1) {
    return strncasecmp(url1, url2, maxlen);
  }
  return strcasecmp(txt1, txt2);
}